

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

Uint32 Diligent::FindImmutableSampler
                 (ImmutableSamplerDesc *ImtblSamplers,Uint32 NumImtblSamplers,
                 SHADER_TYPE ShaderStages,char *ResourceName,char *SamplerSuffix)

{
  bool bVar1;
  SHADER_TYPE SVar2;
  Char *pCVar3;
  undefined1 local_88 [8];
  string msg_1;
  ImmutableSamplerDesc *Sam;
  Uint32 s;
  undefined1 local_50 [8];
  string msg;
  char *SamplerSuffix_local;
  char *ResourceName_local;
  SHADER_TYPE ShaderStages_local;
  Uint32 NumImtblSamplers_local;
  ImmutableSamplerDesc *ImtblSamplers_local;
  
  msg.field_2._8_8_ = SamplerSuffix;
  SamplerSuffix_local = ResourceName;
  ResourceName_local._0_4_ = ShaderStages;
  ResourceName_local._4_4_ = NumImtblSamplers;
  _ShaderStages_local = ImtblSamplers;
  if ((ResourceName == (char *)0x0) || (*ResourceName == '\0')) {
    FormatString<char[26],char[51]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResourceName != nullptr && ResourceName[0] != \'\\0\'",
               (char (*) [51])ResourceName);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"FindImmutableSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x14e);
    std::__cxx11::string::~string((string *)local_50);
  }
  Sam._0_4_ = 0;
  while( true ) {
    if (ResourceName_local._4_4_ <= (uint)Sam) {
      return 0xffffffff;
    }
    msg_1.field_2._8_8_ = _ShaderStages_local + (uint)Sam;
    SVar2 = operator&(((ImmutableSamplerDesc *)msg_1.field_2._8_8_)->ShaderStages,
                      (SHADER_TYPE)ResourceName_local);
    if ((SVar2 != SHADER_TYPE_UNKNOWN) &&
       (bVar1 = StreqSuff(SamplerSuffix_local,*(char **)(msg_1.field_2._8_8_ + 8),
                          (char *)msg.field_2._8_8_,false), bVar1)) break;
    Sam._0_4_ = (uint)Sam + 1;
  }
  SVar2 = operator&(*(SHADER_TYPE *)msg_1.field_2._8_8_,(SHADER_TYPE)ResourceName_local);
  if (SVar2 != (SHADER_TYPE)ResourceName_local) {
    FormatString<char[63],char_const*,char[95]>
              ((string *)local_88,
               (Diligent *)"Immutable sampler uses only some of the stages that resource \'",
               (char (*) [63])&SamplerSuffix_local,
               (char **)
               "\' is defined for. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
               ,(char (*) [95])SamplerSuffix);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"FindImmutableSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x156);
    std::__cxx11::string::~string((string *)local_88);
  }
  return (uint)Sam;
}

Assistant:

Uint32 FindImmutableSampler(const ImmutableSamplerDesc ImtblSamplers[],
                            Uint32                     NumImtblSamplers,
                            SHADER_TYPE                ShaderStages,
                            const char*                ResourceName,
                            const char*                SamplerSuffix)
{
    VERIFY_EXPR(ResourceName != nullptr && ResourceName[0] != '\0');
    for (Uint32 s = 0; s < NumImtblSamplers; ++s)
    {
        const ImmutableSamplerDesc& Sam = ImtblSamplers[s];
        if (((Sam.ShaderStages & ShaderStages) != 0) && StreqSuff(ResourceName, Sam.SamplerOrTextureName, SamplerSuffix))
        {
            VERIFY((Sam.ShaderStages & ShaderStages) == ShaderStages,
                   "Immutable sampler uses only some of the stages that resource '", ResourceName,
                   "' is defined for. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
            return s;
        }
    }

    return InvalidImmutableSamplerIndex;
}